

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImGui::RenderColorRectWithAlphaCheckerboard
               (ImDrawList *draw_list,ImVec2 p_min,ImVec2 p_max,ImU32 col,float grid_step,
               ImVec2 grid_off,float rounding,int rounding_corners_flags)

{
  ImU32 IVar1;
  ImU32 IVar2;
  uint uVar3;
  byte bVar4;
  float fVar5;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  float fVar6;
  ImVec2 local_98;
  ImVec2 local_90;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  ImVec2 local_78;
  ImVec2 local_70;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_98 = p_min;
  local_90 = p_max;
  if (col < 0xff000000) {
    local_68._8_4_ = in_XMM3_Dc;
    local_68._0_8_ = grid_off;
    local_68._12_4_ = in_XMM3_Dd;
    local_88 = grid_step;
    local_84 = rounding;
    IVar1 = ImAlphaBlendColors(0xffcccccc,col);
    IVar1 = GetColorU32(IVar1);
    IVar2 = ImAlphaBlendColors(0xff808080,col);
    IVar2 = GetColorU32(IVar2);
    ImDrawList::AddRectFilled(draw_list,&local_98,&local_90,IVar1,local_84,rounding_corners_flags);
    local_58 = (float)local_68._4_4_ + local_98.y;
    bVar4 = 0;
    fStack_54 = (float)local_68._4_4_;
    fStack_50 = (float)local_68._4_4_;
    fStack_4c = (float)local_68._4_4_;
    fVar6 = local_88;
    while (local_58 < local_90.y) {
      fVar5 = local_90.y;
      if (local_58 <= local_90.y) {
        fVar5 = local_58;
      }
      local_70.y = (float)(-(uint)(local_58 < local_98.y) & (uint)local_98.y |
                          ~-(uint)(local_58 < local_98.y) & (uint)fVar5);
      local_58 = local_58 + fVar6;
      local_78.y = local_58;
      if (local_90.y <= local_58) {
        local_78.y = local_90.y;
      }
      if (local_70.y < local_78.y) {
        uStack_44 = 0;
        uStack_40 = 0;
        uStack_3c = 0;
        local_80 = local_78.y;
        local_48 = local_70.y;
        for (local_7c = (float)bVar4 * fVar6 + local_98.x + (float)local_68._0_4_;
            local_7c < local_90.x; local_7c = local_7c + fVar6 + fVar6) {
          fVar5 = local_90.x;
          if (local_7c <= local_90.x) {
            fVar5 = local_7c;
          }
          local_70.x = (float)(-(uint)(local_7c < local_98.x) & (uint)local_98.x |
                              ~-(uint)(local_7c < local_98.x) & (uint)fVar5);
          local_78.x = local_7c + fVar6;
          if (local_90.x <= local_7c + fVar6) {
            local_78.x = local_90.x;
          }
          if (local_70.x < local_78.x) {
            uVar3 = 0;
            if (local_70.y <= local_98.y) {
              uVar3 = (uint)(local_70.x <= local_98.x);
              if (local_90.x <= local_78.x) {
                uVar3 = local_70.x <= local_98.x | 2;
              }
            }
            if (local_90.y <= local_78.y) {
              if (local_70.x <= local_98.x) {
                uVar3 = uVar3 + 4;
              }
              if (local_90.x <= local_78.x) {
                uVar3 = uVar3 | 8;
              }
            }
            fVar6 = 0.0;
            if ((uVar3 & rounding_corners_flags) != 0) {
              fVar6 = local_84;
            }
            ImDrawList::AddRectFilled
                      (draw_list,&local_70,&local_78,IVar2,fVar6,uVar3 & rounding_corners_flags);
            fVar6 = local_88;
            local_78.y = local_80;
            local_70.y = local_48;
          }
        }
      }
      bVar4 = bVar4 ^ 1;
    }
  }
  else {
    ImDrawList::AddRectFilled(draw_list,&local_98,&local_90,col,rounding,rounding_corners_flags);
  }
  return;
}

Assistant:

void ImGui::RenderColorRectWithAlphaCheckerboard(ImDrawList* draw_list, ImVec2 p_min, ImVec2 p_max, ImU32 col, float grid_step, ImVec2 grid_off, float rounding, int rounding_corners_flags)
{
    if (((col & IM_COL32_A_MASK) >> IM_COL32_A_SHIFT) < 0xFF)
    {
        ImU32 col_bg1 = ImGui::GetColorU32(ImAlphaBlendColors(IM_COL32(204, 204, 204, 255), col));
        ImU32 col_bg2 = ImGui::GetColorU32(ImAlphaBlendColors(IM_COL32(128, 128, 128, 255), col));
        draw_list->AddRectFilled(p_min, p_max, col_bg1, rounding, rounding_corners_flags);

        int yi = 0;
        for (float y = p_min.y + grid_off.y; y < p_max.y; y += grid_step, yi++)
        {
            float y1 = ImClamp(y, p_min.y, p_max.y), y2 = ImMin(y + grid_step, p_max.y);
            if (y2 <= y1)
                continue;
            for (float x = p_min.x + grid_off.x + (yi & 1) * grid_step; x < p_max.x; x += grid_step * 2.0f)
            {
                float x1 = ImClamp(x, p_min.x, p_max.x), x2 = ImMin(x + grid_step, p_max.x);
                if (x2 <= x1)
                    continue;
                int rounding_corners_flags_cell = 0;
                if (y1 <= p_min.y) { if (x1 <= p_min.x) rounding_corners_flags_cell |= ImDrawCornerFlags_TopLeft; if (x2 >= p_max.x) rounding_corners_flags_cell |= ImDrawCornerFlags_TopRight; }
                if (y2 >= p_max.y) { if (x1 <= p_min.x) rounding_corners_flags_cell |= ImDrawCornerFlags_BotLeft; if (x2 >= p_max.x) rounding_corners_flags_cell |= ImDrawCornerFlags_BotRight; }
                rounding_corners_flags_cell &= rounding_corners_flags;
                draw_list->AddRectFilled(ImVec2(x1, y1), ImVec2(x2, y2), col_bg2, rounding_corners_flags_cell ? rounding : 0.0f, rounding_corners_flags_cell);
            }
        }
    }
    else
    {
        draw_list->AddRectFilled(p_min, p_max, col, rounding, rounding_corners_flags);
    }
}